

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<char> * __thiscall TPZVec<char>::operator=(TPZVec<char> *this,initializer_list<char> *list)

{
  iterator pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  
  (*this->_vptr_TPZVec[3])();
  pcVar1 = list->_M_array;
  sVar2 = list->_M_len;
  pcVar3 = this->fStore;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    pcVar3[sVar4] = pcVar1[sVar4];
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}